

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_solver.c
# Opt level: O0

void PDHG_Compute_Primal_Infeasibility
               (CUPDLPwork *work,cupdlp_float *y,cupdlp_float *dSlackPos,cupdlp_float *dSlackNeg,
               cupdlp_float *aty,cupdlp_float dualObj,cupdlp_float *dPrimalInfeasObj,
               cupdlp_float *dPrimalInfeasRes)

{
  long *plVar1;
  long lVar2;
  int *piVar3;
  void *in_RCX;
  void *in_RDX;
  void *in_RSI;
  undefined8 *in_RDI;
  void *in_R8;
  double *in_R9;
  double in_XMM0_Qa;
  cupdlp_float dScale;
  cupdlp_float slackNegSq;
  cupdlp_float slackPosNrmSq;
  cupdlp_float yNrmSq;
  cupdlp_float alpha;
  CUPDLPscaling *scaling;
  CUPDLPresobj *resobj;
  CUPDLPproblem *problem;
  cupdlp_float *pcVar4;
  cupdlp_float *x;
  cupdlp_float weight;
  cupdlp_int n;
  CUPDLPwork *w;
  
  plVar1 = (long *)*in_RDI;
  lVar2 = in_RDI[2];
  piVar3 = (int *)in_RDI[5];
  w = (CUPDLPwork *)0x3ff0000000000000;
  weight = 1.0;
  x = (cupdlp_float *)0x3ff0000000000000;
  pcVar4 = (cupdlp_float *)0x3ff0000000000000;
  memcpy(*(void **)(lVar2 + 0xe8),in_RSI,(long)*(int *)*plVar1 << 3);
  memcpy(*(void **)(lVar2 + 0xf0),in_RDX,(long)*(int *)(*plVar1 + 4) << 3);
  memcpy(*(void **)(lVar2 + 0xf8),in_RCX,(long)*(int *)(*plVar1 + 4) << 3);
  cupdlp_twoNormSquared(w,(cupdlp_int)((ulong)weight >> 0x20),x,pcVar4);
  cupdlp_twoNormSquared(w,(cupdlp_int)((ulong)weight >> 0x20),x,pcVar4);
  cupdlp_twoNormSquared(w,(cupdlp_int)((ulong)weight >> 0x20),x,pcVar4);
  pcVar4 = (cupdlp_float *)sqrt((double)w + weight + (double)x);
  if ((double)pcVar4 < 1e-08) {
    pcVar4 = (cupdlp_float *)0x3ff0000000000000;
  }
  cupdlp_scaleVector(w,weight,x,(cupdlp_int)((ulong)pcVar4 >> 0x20));
  cupdlp_scaleVector(w,weight,x,(cupdlp_int)((ulong)pcVar4 >> 0x20));
  cupdlp_scaleVector(w,weight,x,(cupdlp_int)((ulong)pcVar4 >> 0x20));
  *in_R9 = ((in_XMM0_Qa - (double)plVar1[0xc]) / (double)plVar1[0xd]) / (double)pcVar4;
  memcpy(*(void **)(lVar2 + 0x100),in_R8,(long)*(int *)(*plVar1 + 4) << 3);
  cupdlp_scaleVector(w,weight,x,(cupdlp_int)((ulong)pcVar4 >> 0x20));
  n = (cupdlp_int)((ulong)weight >> 0x20);
  cupdlp_axpy(w,n,x,pcVar4,(cupdlp_float *)0x7fdf9f);
  cupdlp_axpy(w,n,x,pcVar4,(cupdlp_float *)0x7fdfdf);
  if (*piVar3 != 0) {
    cupdlp_edot(x,pcVar4,0);
  }
  cupdlp_twoNorm(w,n,x,pcVar4);
  return;
}

Assistant:

void PDHG_Compute_Primal_Infeasibility(CUPDLPwork *work, const cupdlp_float *y,
                                       const cupdlp_float *dSlackPos,
                                       const cupdlp_float *dSlackNeg,
                                       const cupdlp_float *aty,
                                       const cupdlp_float dualObj,
                                       cupdlp_float *dPrimalInfeasObj,
                                       cupdlp_float *dPrimalInfeasRes) {
  CUPDLPproblem *problem = work->problem;
  CUPDLPresobj *resobj = work->resobj;
  CUPDLPscaling *scaling = work->scaling;

  cupdlp_float alpha;

  cupdlp_float yNrmSq = 1.0;
  cupdlp_float slackPosNrmSq = 1.0;
  cupdlp_float slackNegSq = 1.0;
  cupdlp_float dScale = 1.0;

  // cupdlp_float dConstrResSq = 0.0;
  // y and lambda must be feasible, no need to check bound
  // cupdlp_float dBoundLbResSq = 0.0;
  // cupdlp_float dBoundUbResSq = 0.0;

#if !defined(CUPDLP_CPU) && USE_KERNELS
  cupdlp_twoNormSquared(work, problem->data->nRows, y, &yNrmSq);
  cupdlp_twoNormSquared(work, problem->data->nCols, dSlackPos, &slackPosNrmSq);
  cupdlp_twoNormSquared(work, problem->data->nCols, dSlackNeg, &slackNegSq);
  dScale = sqrt(yNrmSq + slackPosNrmSq + slackNegSq);
  // dScale /= sqrt(problem->data->nRows + 2 * problem->data->nCols);
  if (dScale < 1e-8) {
    dScale = 1.0;
  }

  // dual obj
  *dPrimalInfeasObj =
      (dualObj - problem->offset) / problem->sense_origin / dScale;

  // dual constraints [ATy1 + GTy2 + lambda]

  cupdlp_primal_infeasibility_kernel_cuda(work->buffer2, aty, dSlackPos,
                                          dSlackNeg, work->colScale, 1.0 / dScale,
                                          scaling->ifScaled, problem->data->nCols);

  // cupdlp_twoNormSquared(work, problem->data->nCols, resobj->dualInfeasConstr,
  //                       &dConstrResSq);
  cupdlp_twoNorm(work, problem->data->nCols, work->buffer2,
                 dPrimalInfeasRes);

  // dual bound
  // always satisfied, no need to check

#else

  // y, ldb ray
  CUPDLP_COPY_VEC(resobj->dualInfeasRay, y, cupdlp_float, problem->data->nRows);
  CUPDLP_COPY_VEC(resobj->dualInfeasLbRay, dSlackPos, cupdlp_float,
                  problem->data->nCols);
  CUPDLP_COPY_VEC(resobj->dualInfeasUbRay, dSlackNeg, cupdlp_float,
                  problem->data->nCols);
  cupdlp_twoNormSquared(work, problem->data->nRows, resobj->dualInfeasRay,
                        &yNrmSq);
  cupdlp_twoNormSquared(work, problem->data->nCols, resobj->dualInfeasLbRay,
                        &slackPosNrmSq);
  cupdlp_twoNormSquared(work, problem->data->nCols, resobj->dualInfeasUbRay,
                        &slackNegSq);
  dScale = sqrt(yNrmSq + slackPosNrmSq + slackNegSq);
  // dScale /= sqrt(problem->data->nRows + 2 * problem->data->nCols);
  if (dScale < 1e-8) {
    dScale = 1.0;
  }
  cupdlp_scaleVector(work, 1 / dScale, resobj->dualInfeasRay,
                     problem->data->nRows);
  cupdlp_scaleVector(work, 1 / dScale, resobj->dualInfeasLbRay,
                     problem->data->nCols);
  cupdlp_scaleVector(work, 1 / dScale, resobj->dualInfeasUbRay,
                     problem->data->nCols);

  // dual obj
  *dPrimalInfeasObj =
      (dualObj - problem->offset) / problem->sense_origin / dScale;

  // dual constraints [ATy1 + GTy2 + lambda]
  CUPDLP_COPY_VEC(resobj->dualInfeasConstr, aty, cupdlp_float,
                  problem->data->nCols);
  cupdlp_scaleVector(work, 1.0 / dScale, resobj->dualInfeasConstr,
                     problem->data->nCols);
  alpha = 1.0;
  cupdlp_axpy(work, problem->data->nCols, &alpha, resobj->dualInfeasLbRay,
              resobj->dualInfeasConstr);
  alpha = -1.0;
  cupdlp_axpy(work, problem->data->nCols, &alpha, resobj->dualInfeasUbRay,
              resobj->dualInfeasConstr);
  if (scaling->ifScaled) {
    cupdlp_edot(resobj->dualInfeasConstr, work->colScale, problem->data->nCols);
  }
  // cupdlp_twoNormSquared(work, problem->data->nCols, resobj->dualInfeasConstr,
  //                       &dConstrResSq);
  cupdlp_twoNorm(work, problem->data->nCols, resobj->dualInfeasConstr,
                 dPrimalInfeasRes);

  // dual bound
  // always satisfied, no need to check

#endif

}